

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::NewAllocation(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
                *this,size_t bytes,ushort pdataCount,ushort xdataSize,
               bool canAllocInPreReservedHeapPageSegment,bool isAnyJittedCode)

{
  code *pcVar1;
  TEmitBufferAllocation *pTVar2;
  bool bVar3;
  undefined4 *puVar4;
  JITManager *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  Allocation *pAVar6;
  TrackAllocData local_78;
  TEmitBufferAllocation *local_50;
  TEmitBufferAllocation *allocation;
  undefined1 local_38 [8];
  AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
  allocatedMemory;
  Allocation *heapAllocation;
  bool isAllJITCodeInPreReservedRegion;
  bool isAnyJittedCode_local;
  bool canAllocInPreReservedHeapPageSegment_local;
  ushort xdataSize_local;
  size_t sStack_18;
  ushort pdataCount_local;
  size_t bytes_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
  *this_local;
  
  heapAllocation._2_1_ = isAnyJittedCode;
  heapAllocation._3_1_ = canAllocInPreReservedHeapPageSegment;
  heapAllocation._4_2_ = xdataSize;
  heapAllocation._6_2_ = pdataCount;
  sStack_18 = bytes;
  bytes_local = (size_t)this;
  bVar3 = FakeCriticalSection::IsLocked(&this->criticalSection);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x97,"(this->criticalSection.IsLocked())","this->criticalSection.IsLocked()"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  heapAllocation._1_1_ = 1;
  allocatedMemory._allocationHeap =
       (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
       Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
       ::Alloc(&this->allocationHeap,sStack_18,heapAllocation._6_2_,heapAllocation._4_2_,
               (bool)(heapAllocation._3_1_ & 1),(bool)(heapAllocation._2_1_ & 1),
               (bool *)((long)&heapAllocation + 1));
  if (allocatedMemory._allocationHeap ==
      (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    this_00 = JITManager::GetJITManager();
    bVar3 = JITManager::IsJITServer(this_00);
    if (!bVar3) {
      JsUtil::ExternalApi::RecoverUnusedMemory();
      allocatedMemory._allocationHeap =
           (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
           Memory::CustomHeap::
           Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::Alloc
                     (&this->allocationHeap,sStack_18,heapAllocation._6_2_,heapAllocation._4_2_,
                      (bool)(heapAllocation._3_1_ & 1),(bool)(heapAllocation._2_1_ & 1),
                      (bool *)((long)&heapAllocation + 1));
    }
  }
  if (allocatedMemory._allocationHeap !=
      (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    *(byte *)&(allocatedMemory._allocationHeap)->auxiliaryAllocator =
         *(byte *)&(allocatedMemory._allocationHeap)->auxiliaryAllocator & 0xfe | 1;
    AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    AutoCustomHeapPointer
              ((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                *)local_38,&this->allocationHeap,(Allocation *)allocatedMemory._allocationHeap);
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,L"New allocation: 0x%p, size: %p\n",
                    (allocatedMemory._allocationHeap)->freesSinceLastCompact,
                    (allocatedMemory._allocationHeap)->codePageAllocators);
    }
    pAVar5 = &this->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_78,
               (type_info *)
               &EmitBufferAllocation<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
               ,0xb2);
    pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar5,&local_78);
    local_50 = (TEmitBufferAllocation *)
               new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar5,0x3f67b0);
    local_50->bytesCommitted = (size_t)(allocatedMemory._allocationHeap)->codePageAllocators;
    pAVar6 = AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
             ::Detach((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                       *)local_38);
    pTVar2 = local_50;
    local_50->allocation = pAVar6;
    local_50->bytesUsed = 0;
    local_50->nextAllocation = this->allocations;
    local_50->recorded = false;
    local_50->inPrereservedRegion = (bool)(heapAllocation._1_1_ & 1);
    this->allocations = local_50;
    this->totalBytesCommitted =
         (size_t)(((allocatedMemory._allocationHeap)->codePageAllocators->cs).super_CCLock.mutexPtr
                 + this->totalBytesCommitted);
    AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    ~AutoCustomHeapPointer
              ((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                *)local_38);
    return pTVar2;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc> *
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::NewAllocation(size_t bytes, ushort pdataCount, ushort xdataSize, bool canAllocInPreReservedHeapPageSegment, bool isAnyJittedCode)
{
    FAULTINJECT_MEMORY_THROW(_u("JIT"), bytes);

    Assert(this->criticalSection.IsLocked());

    bool isAllJITCodeInPreReservedRegion = true;
    CustomHeap::Allocation* heapAllocation = this->allocationHeap.Alloc(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode, &isAllJITCodeInPreReservedRegion);

    if (heapAllocation  == nullptr)
    {
        if (!JITManager::GetJITManager()->IsJITServer())
        {
            // This is used in interpreter scenario, thus we need to try to recover memory, if possible.
            // Can't simply throw as in JIT scenario, for which throw is what we want in order to give more mem to interpreter.
            JsUtil::ExternalApi::RecoverUnusedMemory();
            heapAllocation = this->allocationHeap.Alloc(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode, &isAllJITCodeInPreReservedRegion);
        }
    }

    if (heapAllocation  == nullptr)
    {
        Js::Throw::OutOfMemory();
    }

#if DBG
    heapAllocation->isAllocationUsed = true;
#endif

    AutoCustomHeapPointer<TAlloc, TPreReservedAlloc> allocatedMemory(&this->allocationHeap, heapAllocation);
    VerboseHeapTrace(_u("New allocation: 0x%p, size: %p\n"), heapAllocation->address, heapAllocation->size);
    TEmitBufferAllocation * allocation = AnewStruct(this->allocator, TEmitBufferAllocation);

    allocation->bytesCommitted = heapAllocation->size;
    allocation->allocation = allocatedMemory.Detach();
    allocation->bytesUsed = 0;
    allocation->nextAllocation = this->allocations;
    allocation->recorded = false;
    allocation->inPrereservedRegion = isAllJITCodeInPreReservedRegion;

    this->allocations = allocation;

#if DBG_DUMP
    this->totalBytesCommitted += heapAllocation->size;
#endif

    return allocation;
}